

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t count_high32(roaring64_bitmap_t *r)

{
  int iVar1;
  uint64_t uVar2;
  uint32_t current_high32;
  uint32_t prev_high32;
  uint64_t high32_count;
  art_iterator_t it;
  int iVar3;
  uint8_t *high48;
  _Bool in_stack_ffffffffffffff6f;
  art_t *in_stack_ffffffffffffff70;
  
  art_init_iterator(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  high48 = (uint8_t *)0x0;
  iVar3 = 0;
  while (in_stack_ffffffffffffff70 != (art_t *)0x0) {
    uVar2 = combine_key(high48,(uint16_t)((uint)iVar3 >> 0x10));
    iVar1 = (int)(uVar2 >> 0x20);
    if ((high48 == (uint8_t *)0x0) || (iVar3 != iVar1)) {
      high48 = high48 + 1;
      iVar3 = iVar1;
    }
    art_iterator_next((art_iterator_t *)0x144ae2);
  }
  return (uint64_t)high48;
}

Assistant:

static inline uint64_t count_high32(const roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    uint64_t high32_count = 0;
    uint32_t prev_high32 = 0;
    while (it.value != NULL) {
        uint32_t current_high32 = (uint32_t)(combine_key(it.key, 0) >> 32);
        if (high32_count == 0 || prev_high32 != current_high32) {
            high32_count++;
            prev_high32 = current_high32;
        }
        art_iterator_next(&it);
    }
    return high32_count;
}